

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O3

int repeat_segment_data_resize_buffer(repeat_segment_data *data,uint32_t new_size)

{
  float *pfVar1;
  
  pfVar1 = (float *)crealloc(data->buffer,(ulong)data->buffer_size,(ulong)new_size,4);
  if (pfVar1 == (float *)0x0) {
    mixed_err(1);
  }
  else {
    data->buffer = pfVar1;
    data->buffer_size = new_size;
    data->buffer_index = 0;
  }
  return (uint)(pfVar1 != (float *)0x0);
}

Assistant:

int repeat_segment_data_resize_buffer(struct repeat_segment_data *data, uint32_t new_size) {
  float *new_buffer = crealloc(data->buffer, data->buffer_size, new_size, sizeof(float));
  if (!new_buffer){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }
  data->buffer = new_buffer;
  data->buffer_size = new_size;
  data->buffer_index = 0;
  return 1;
}